

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::ReloadStyleSheet(ElementDocument *this)

{
  bool bVar1;
  pointer pSVar2;
  undefined8 uVar3;
  String *document_base_tag;
  pointer base_instance;
  ElementDocument *pEVar4;
  shared_ptr<Rml::StyleSheetContainer> local_40;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_30;
  ElementPtr temp_doc;
  unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> local_18;
  UniquePtr<Rml::StreamFile> stream;
  ElementDocument *this_local;
  
  if (this->context != (Context *)0x0) {
    stream._M_t.super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>._M_t.
    super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
    super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
         (__uniq_ptr_data<Rml::StreamFile,_std::default_delete<Rml::StreamFile>,_true,_true>)
         (__uniq_ptr_data<Rml::StreamFile,_std::default_delete<Rml::StreamFile>,_true,_true>)this;
    MakeUnique<Rml::StreamFile>();
    pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::operator->
                       (&local_18);
    bVar1 = StreamFile::Open(pSVar2,&this->source_url);
    if (bVar1) {
      Factory::ClearStyleSheetCache();
      Factory::ClearTemplateCache();
      pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::get
                         (&local_18);
      document_base_tag = Context::GetDocumentsBaseTag_abi_cxx11_(this->context);
      Factory::InstanceDocumentStream
                ((Factory *)&local_30,(Context *)0x0,&pSVar2->super_Stream,document_base_tag);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
      if (bVar1) {
        base_instance =
             ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_30);
        pEVar4 = rmlui_static_cast<Rml::ElementDocument*,Rml::Element*>(base_instance);
        ::std::shared_ptr<Rml::StyleSheetContainer>::shared_ptr
                  (&local_40,&pEVar4->style_sheet_container);
        SetStyleSheetContainer(this,&local_40);
        ::std::shared_ptr<Rml::StyleSheetContainer>::~shared_ptr(&local_40);
      }
      else {
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Failed to reload style sheet, could not instance document: %s",
                     uVar3);
      }
      temp_doc._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._1_3_ = 0;
      temp_doc._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._0_1_ = !bVar1;
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_30);
    }
    else {
      uVar3 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Failed to open file to reload style sheet in document: %s",uVar3);
      temp_doc._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._0_4_ = 1;
    }
    ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr
              (&local_18);
  }
  return;
}

Assistant:

void ElementDocument::ReloadStyleSheet()
{
	if (!context)
		return;

	auto stream = MakeUnique<StreamFile>();
	if (!stream->Open(source_url))
	{
		Log::Message(Log::LT_WARNING, "Failed to open file to reload style sheet in document: %s", source_url.c_str());
		return;
	}

	Factory::ClearStyleSheetCache();
	Factory::ClearTemplateCache();
	ElementPtr temp_doc = Factory::InstanceDocumentStream(nullptr, stream.get(), context->GetDocumentsBaseTag());
	if (!temp_doc)
	{
		Log::Message(Log::LT_WARNING, "Failed to reload style sheet, could not instance document: %s", source_url.c_str());
		return;
	}

	SetStyleSheetContainer(rmlui_static_cast<ElementDocument*>(temp_doc.get())->style_sheet_container);
}